

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O0

size_t cesl_long_to_str(long value,char *dst_str,uint8_t base)

{
  size_t sVar1;
  uint8_t base_local;
  char *dst_str_local;
  long value_local;
  
  sVar1 = cesl_int64_to_str(value,dst_str,base);
  return sVar1;
}

Assistant:

size_t cesl_long_to_str(long value, char* dst_str, uint8_t base)
{
#if (LONG_MAX == INT64_MAX)
    return cesl_int64_to_str(value, dst_str, base);
#elif (LONG_MAX == INT32_MAX)
    return cesl_int32_to_str(value, dst_str, base);
#else
#error cesl_long_to_string__not_supported_on_this_platfform
#endif
}